

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_s_rrr_shi(DisasContext_conflict1 *s,arg_s_rrr_shi *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 var;
  TCGv_i32 var_00;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  var = load_reg(s,a->rm);
  gen_arm_shift_im(tcg_ctx,var,a->shty,a->shim,logic_cc);
  var_00 = load_reg(s,a->rn);
  (*gen)(tcg_ctx,var_00,var_00,var);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  if (logic_cc != 0) {
    gen_logic_CC(tcg_ctx,var_00);
  }
  _Var1 = store_reg_kind(s,a->rd,var_00,kind);
  return _Var1;
}

Assistant:

static bool op_s_rrr_shi(DisasContext *s, arg_s_rrr_shi *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_im(tcg_ctx, tmp2, a->shty, a->shim, logic_cc);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}